

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::commit(raft_server *this,ulong target_idx)

{
  element_type *peVar1;
  ulong uVar2;
  __int_type _Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  nuraft_global_mgr *this_00;
  __node_base *p_Var6;
  ptr<peer> pp;
  __shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if ((this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i < target_idx) {
    LOCK();
    (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = target_idx;
    UNLOCK();
    LOCK();
    (this->lagging_sm_target_index_).super___atomic_base<unsigned_long>._M_i = target_idx;
    UNLOCK();
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar5 = (*peVar1->_vptr_logger[7])();
      if (4 < iVar5) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&pp,"trigger commit upto %lu",
                   (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i);
        (*peVar1->_vptr_logger[8])
                  (peVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit",0x2d,&pp);
        std::__cxx11::string::~string((string *)&pp);
      }
    }
    if ((this->role_)._M_i == leader) {
      p_Var6 = &(this->peers_)._M_h._M_before_begin;
      while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
        std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)(p_Var6 + 2));
        std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
        bVar4 = request_append_entries(this,(ptr<peer> *)&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        if (!bVar4) {
          LOCK();
          *(undefined1 *)
           (CONCAT44(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                     (int32)pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           + 0x89) = 1;
          UNLOCK();
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar5 = (*peVar1->_vptr_logger[7])();
    if (5 < iVar5) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar5 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      msg_if_given_abi_cxx11_
                ((string *)&pp,
                 "local log idx %lu, target_commit_idx %lu, quick_commit_index_ %lu, state_->get_commit_idx() %lu"
                 ,CONCAT44(extraout_var,iVar5) + -1,target_idx,
                 (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i,
                 (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i);
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit",0x3f,&pp);
      std::__cxx11::string::~string((string *)&pp);
    }
  }
  iVar5 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_log_store[2])();
  if (((this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
       CONCAT44(extraout_var_00,iVar5) - 1U) &&
     ((this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
      (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i)) {
    this_00 = nuraft_global_mgr::get_instance();
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 == (nuraft_global_mgr *)0x0) {
      if (peVar1 != (element_type *)0x0) {
        iVar5 = (*peVar1->_vptr_logger[7])();
        if (5 < iVar5) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)&pp,"commit_cv_ notify (local thread)");
          (*peVar1->_vptr_logger[8])
                    (peVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"commit",0x4a,&pp);
          std::__cxx11::string::~string((string *)&pp);
        }
      }
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)&pp,&this->commit_cv_lock_);
      std::condition_variable::notify_one();
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&pp);
    }
    else {
      if (peVar1 != (element_type *)0x0) {
        iVar5 = (*peVar1->_vptr_logger[7])();
        if (5 < iVar5) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)&pp,"request commit to global thread pool");
          (*peVar1->_vptr_logger[8])
                    (peVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"commit",0x47,&pp);
          std::__cxx11::string::~string((string *)&pp);
        }
      }
      std::__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<nuraft::raft_server,void>
                (local_50,(__weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)
                          &this->super_enable_shared_from_this<nuraft::raft_server>);
      nuraft_global_mgr::request_commit(this_00,(ptr<raft_server> *)local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    }
  }
  else if ((this->role_)._M_i == follower) {
    uVar2 = (this->leader_commit_index_).super___atomic_base<unsigned_long>._M_i;
    _Var3 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
    if (((this->data_fresh_)._M_base._M_i & 1U) == 0) {
      nuraft::context::get_params((context *)&pp);
      iVar5 = *(int *)(CONCAT44(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr._4_4_,
                                (int32)pp.
                                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr) + 0x30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (uVar2 < _Var3 + (long)iVar5) {
        LOCK();
        (this->data_fresh_)._M_base._M_i = true;
        UNLOCK();
        pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = this->id_;
        pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             (this->leader_).super___atomic_base<int>._M_i;
        pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
             0xffffffff;
        cb_func::call(&((this->ctx_)._M_t.
                        super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                        .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                      BecomeFresh,(Param *)&pp);
      }
    }
  }
  return;
}

Assistant:

void raft_server::commit(ulong target_idx) {
    if (target_idx > quick_commit_index_) {
        quick_commit_index_ = target_idx;
        lagging_sm_target_index_ = target_idx;
        p_db( "trigger commit upto %" PRIu64 "", quick_commit_index_.load() );

        // if this is a leader notify peers to commit as well
        // for peers that are free, send the request, otherwise,
        // set pending commit flag for that peer
        if (role_ == srv_role::leader) {
            for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
                ptr<peer> pp = it->second;
                if (!request_append_entries(pp)) {
                    pp->set_pending_commit();
                }
            }
        }
    }

    p_tr( "local log idx %" PRIu64 ", target_commit_idx %" PRIu64 ", "
          "quick_commit_index_ %" PRIu64 ", state_->get_commit_idx() %" PRIu64 "",
          log_store_->next_slot() - 1, target_idx,
          quick_commit_index_.load(), sm_commit_index_.load() );

    if ( log_store_->next_slot() - 1 > sm_commit_index_ &&
         quick_commit_index_ > sm_commit_index_ ) {

        nuraft_global_mgr* mgr = nuraft_global_mgr::get_instance();
        if (mgr) {
            // Global thread pool exists, request it.
            p_tr("request commit to global thread pool");
            mgr->request_commit( this->shared_from_this() );
        } else {
            p_tr("commit_cv_ notify (local thread)");
            std::unique_lock<std::mutex> lock(commit_cv_lock_);
            commit_cv_.notify_one();
        }

    } else {
        /*
         * After raft server (re-)start, if its log entry is as fresh as leader,
         * then commit thread will not be notified. But we need to tell the app,
         * whose status rely on raft server, that now raft server is fresh.
         */
        if (role_ == srv_role::follower) {
            ulong leader_idx = leader_commit_index_.load();
            ulong local_idx = sm_commit_index_.load();
            if (!data_fresh_.load() &&
                leader_idx < local_idx + ctx_->get_params()->fresh_log_gap_) {
                data_fresh_.store(true);
                cb_func::Param param(id_, leader_);
                (void) ctx_->cb_func_.call(cb_func::BecomeFresh, &param);
            }
        }
    }
}